

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5UnicodeTokenize(Fts5Tokenizer *pTokenizer,void *pCtx,int iUnused,char *pText,int nText,
                       _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  byte bVar6;
  uint *puVar7;
  byte *pbVar8;
  int iVar9;
  byte *pbVar10;
  uint uVar11;
  byte *pbVar12;
  uint *local_60;
  int local_58;
  ulong local_50;
  uint *local_48;
  
  pbVar12 = (byte *)(pText + nText);
  local_60 = *(uint **)(pTokenizer + 0x80);
  local_50 = (ulong)*(int *)(pTokenizer + 0x88);
  puVar5 = (uint *)((long)local_60 + (local_50 - 6));
  uVar3 = 0;
  pbVar10 = (byte *)pText;
  local_48 = puVar5;
  do {
    if (uVar3 != 0) {
LAB_001f494a:
      uVar11 = 0;
      if (uVar3 != 0x65) {
        uVar11 = uVar3;
      }
      return uVar11;
    }
    uVar3 = 0;
LAB_001f45a6:
    iVar4 = 6;
    if (pbVar12 <= pbVar10) goto LAB_001f477e;
    bVar1 = *pbVar10;
    puVar5 = (uint *)(long)(char)bVar1;
    iVar9 = (int)pbVar10;
    local_58 = (int)pText;
    puVar7 = local_60;
    if ((long)puVar5 < 0) {
      uVar11 = (uint)bVar1;
      pbVar10 = pbVar10 + 1;
      if (0xbf < bVar1) {
        uVar2 = (uint)""[bVar1 - 0xc0];
        for (; (pbVar10 < pbVar12 && ((*pbVar10 & 0xffffffc0) == 0x80)); pbVar10 = pbVar10 + 1) {
          uVar2 = uVar2 << 6 | *pbVar10 & 0x3f;
        }
        uVar11 = uVar2;
        if ((uVar2 & 0xfffff800) == 0xd800) {
          uVar11 = 0xfffd;
        }
        if (uVar2 < 0x80) {
          uVar11 = 0xfffd;
        }
        if ((uVar2 & 0xfffffffe) == 0xfffe) {
          uVar11 = 0xfffd;
        }
      }
      uVar2 = fts5UnicodeIsAlnum((Unicode61Tokenizer *)pTokenizer,uVar11);
      puVar5 = (uint *)(ulong)uVar2;
      if (uVar2 != 0) {
        iVar9 = iVar9 - local_58;
        goto LAB_001f487e;
      }
      goto LAB_001f45a6;
    }
    if (pTokenizer[(long)puVar5] == (Fts5Tokenizer)0x0) {
      pbVar10 = pbVar10 + 1;
      goto LAB_001f45a6;
    }
    iVar9 = iVar9 - local_58;
    pbVar8 = pbVar10;
    do {
      bVar1 = *pbVar8;
      bVar6 = bVar1 + 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar6 = bVar1;
      }
      *(byte *)puVar7 = bVar6;
      puVar7 = (uint *)((long)puVar7 + 1);
      pbVar8 = pbVar8 + 1;
      while( true ) {
        pbVar10 = pbVar8;
        if (pbVar12 <= pbVar8) goto LAB_001f475b;
        if (local_48 < puVar7) {
          uVar3 = sqlite3_initialize();
          puVar5 = (uint *)(ulong)uVar3;
          local_60 = (uint *)0x0;
          if (uVar3 == 0) {
            puVar5 = (uint *)sqlite3Malloc((long)(int)local_50 * 2);
            local_60 = puVar5;
          }
          if (local_60 == (uint *)0x0) {
            uVar3 = 7;
            local_60 = (uint *)0x0;
            iVar4 = 6;
            goto LAB_001f477e;
          }
          puVar7 = (uint *)(((long)puVar7 - (long)*(void **)(pTokenizer + 0x80)) + (long)local_60);
          memcpy(local_60,*(void **)(pTokenizer + 0x80),(long)(int)local_50);
          sqlite3_free(*(void **)(pTokenizer + 0x80));
          *(uint **)(pTokenizer + 0x80) = local_60;
          uVar3 = (int)local_50 * 2;
          local_50 = (ulong)uVar3;
          *(uint *)(pTokenizer + 0x88) = uVar3;
          local_48 = (uint *)((long)local_60 + (long)(int)uVar3 + -6);
        }
        bVar1 = *pbVar8;
        if (-1 < (long)(char)bVar1) break;
        uVar11 = (uint)bVar1;
        pbVar10 = pbVar8 + 1;
        if (0xbf < bVar1) {
          uVar3 = (uint)""[bVar1 - 0xc0];
          for (; (pbVar10 < pbVar12 && ((*pbVar10 & 0xffffffc0) == 0x80)); pbVar10 = pbVar10 + 1) {
            uVar3 = uVar3 << 6 | *pbVar10 & 0x3f;
          }
          uVar11 = uVar3;
          if ((uVar3 & 0xfffff800) == 0xd800) {
            uVar11 = 0xfffd;
          }
          if (uVar3 < 0x80) {
            uVar11 = 0xfffd;
          }
          if ((uVar3 & 0xfffffffe) == 0xfffe) {
            uVar11 = 0xfffd;
          }
        }
        iVar4 = fts5UnicodeIsAlnum((Unicode61Tokenizer *)pTokenizer,uVar11);
        if (iVar4 == 0) {
          uVar3 = 0;
          if (0xffffffcd < uVar11 - 0x332) {
            uVar3 = 1 << ((byte)uVar11 & 0x1f);
            if ((int)uVar11 < 800) {
              uVar3 = uVar3 & 0x8029fdf;
            }
            else {
              uVar3 = uVar3 & 0x361f8;
            }
          }
          if (uVar3 == 0) goto LAB_001f475b;
        }
LAB_001f487e:
        uVar3 = sqlite3Fts5UnicodeFold(uVar11,*(int *)(pTokenizer + 0x8c));
        pbVar8 = pbVar10;
        if (uVar3 != 0) {
          bVar1 = (byte)uVar3;
          if (uVar3 < 0x80) {
            *(byte *)puVar7 = bVar1;
            puVar7 = (uint *)((long)puVar7 + 1);
          }
          else if (uVar3 < 0x800) {
            *(byte *)puVar7 = (byte)(uVar3 >> 6) | 0xc0;
            *(byte *)((long)puVar7 + 1) = bVar1 & 0x3f | 0x80;
            puVar7 = (uint *)((long)puVar7 + 2);
          }
          else if (uVar3 < 0x10000) {
            *(byte *)puVar7 = (byte)(uVar3 >> 0xc) | 0xe0;
            *(byte *)((long)puVar7 + 1) = (byte)(uVar3 >> 6) & 0x3f | 0x80;
            *(byte *)((long)puVar7 + 2) = bVar1 & 0x3f | 0x80;
            puVar7 = (uint *)((long)puVar7 + 3);
          }
          else {
            *puVar7 = (uVar3 << 0x18 |
                      (uVar3 & 0x3fc0) << 10 | uVar3 >> 0x12 & 0xff | uVar3 >> 4 & 0xff00) &
                      DAT_0020b2a0 | DAT_0020b2b0;
            puVar7 = puVar7 + 1;
          }
        }
      }
    } while (pTokenizer[(char)bVar1] != (Fts5Tokenizer)0x0);
LAB_001f475b:
    iVar4 = 0;
    uVar3 = (*xToken)(pCtx,0,(char *)local_60,(int)puVar7 - (int)local_60,iVar9,
                      (int)pbVar8 - local_58);
    puVar5 = (uint *)(ulong)uVar3;
LAB_001f477e:
    if (iVar4 != 0) {
      if (iVar4 != 6) {
        return (int)puVar5;
      }
      goto LAB_001f494a;
    }
  } while( true );
}

Assistant:

static int fts5UnicodeTokenize(
  Fts5Tokenizer *pTokenizer,
  void *pCtx,
  int iUnused,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int nToken, int iStart, int iEnd)
){
  Unicode61Tokenizer *p = (Unicode61Tokenizer*)pTokenizer;
  int rc = SQLITE_OK;
  unsigned char *a = p->aTokenChar;

  unsigned char *zTerm = (unsigned char*)&pText[nText];
  unsigned char *zCsr = (unsigned char *)pText;

  /* Output buffer */
  char *aFold = p->aFold;
  int nFold = p->nFold;
  const char *pEnd = &aFold[nFold-6];

  UNUSED_PARAM(iUnused);

  /* Each iteration of this loop gobbles up a contiguous run of separators,
  ** then the next token.  */
  while( rc==SQLITE_OK ){
    u32 iCode;                    /* non-ASCII codepoint read from input */
    char *zOut = aFold;
    int is;
    int ie;

    /* Skip any separator characters. */
    while( 1 ){
      if( zCsr>=zTerm ) goto tokenize_done;
      if( *zCsr & 0x80 ) {
        /* A character outside of the ascii range. Skip past it if it is
        ** a separator character. Or break out of the loop if it is not. */
        is = zCsr - (unsigned char*)pText;
        READ_UTF8(zCsr, zTerm, iCode);
        if( fts5UnicodeIsAlnum(p, iCode) ){
          goto non_ascii_tokenchar;
        }
      }else{
        if( a[*zCsr] ){
          is = zCsr - (unsigned char*)pText;
          goto ascii_tokenchar;
        }
        zCsr++;
      }
    }

    /* Run through the tokenchars. Fold them into the output buffer along
    ** the way.  */
    while( zCsr<zTerm ){

      /* Grow the output buffer so that there is sufficient space to fit the
      ** largest possible utf-8 character.  */
      if( zOut>pEnd ){
        aFold = sqlite3_malloc64((sqlite3_int64)nFold*2);
        if( aFold==0 ){
          rc = SQLITE_NOMEM;
          goto tokenize_done;
        }
        zOut = &aFold[zOut - p->aFold];
        memcpy(aFold, p->aFold, nFold);
        sqlite3_free(p->aFold);
        p->aFold = aFold;
        p->nFold = nFold = nFold*2;
        pEnd = &aFold[nFold-6];
      }

      if( *zCsr & 0x80 ){
        /* An non-ascii-range character. Fold it into the output buffer if
        ** it is a token character, or break out of the loop if it is not. */
        READ_UTF8(zCsr, zTerm, iCode);
        if( fts5UnicodeIsAlnum(p,iCode)||sqlite3Fts5UnicodeIsdiacritic(iCode) ){
 non_ascii_tokenchar:
          iCode = sqlite3Fts5UnicodeFold(iCode, p->eRemoveDiacritic);
          if( iCode ) WRITE_UTF8(zOut, iCode);
        }else{
          break;
        }
      }else if( a[*zCsr]==0 ){
        /* An ascii-range separator character. End of token. */
        break;
      }else{
 ascii_tokenchar:
        if( *zCsr>='A' && *zCsr<='Z' ){
          *zOut++ = *zCsr + 32;
        }else{
          *zOut++ = *zCsr;
        }
        zCsr++;
      }
      ie = zCsr - (unsigned char*)pText;
    }

    /* Invoke the token callback */
    rc = xToken(pCtx, 0, aFold, zOut-aFold, is, ie);
  }

 tokenize_done:
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  return rc;
}